

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

StructBuilder * __thiscall
capnp::_::OrphanBuilder::asStruct
          (StructBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize size)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  CapTableBuilder *capTable;
  BuilderArena *this_00;
  ushort uVar4;
  int iVar5;
  SegmentBuilder *this_01;
  SegmentBuilder *pSVar6;
  undefined8 *puVar8;
  word *pwVar9;
  StructSize SVar13;
  StructSize SVar14;
  OrphanBuilder *ref;
  uint uVar11;
  WirePointer *src;
  WirePointer *pWVar12;
  word *result_1;
  word *pwVar15;
  ushort uVar16;
  uint uVar17;
  ulong uVar18;
  WirePointer *dst;
  AllocateResult AVar19;
  AllocateResult AVar20;
  uint local_90;
  Fault f;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  SegmentBuilder *pSVar7;
  OrphanBuilder *pOVar10;
  
  pSVar7 = this->segment;
  capTable = this->capTable;
  this_00 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
  uVar11 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  uVar16 = size.pointers;
  ref = this;
  if (id.value != 0 || uVar11 != 0) {
    if ((uVar11 & 3) == 2) {
      this_01 = BuilderArena::getSegment(this_00,id);
      uVar11 = (uint)(this->tag).content;
      pwVar9 = (this_01->super_SegmentReader).ptr.ptr;
      uVar18 = (ulong)(uVar11 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar9->content + uVar18);
      pOVar10 = (OrphanBuilder *)((long)&pwVar9[1].content + uVar18);
      if ((uVar11 & 4) == 0) {
        pwVar9 = &pOVar10->tag + ((int)(pOVar1->tag).content >> 2);
        pOVar10 = pOVar1;
      }
      else {
        this_01 = BuilderArena::getSegment
                            ((BuilderArena *)(this_01->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar9 = (word *)((long)&((this_01->super_SegmentReader).ptr.ptr)->content +
                         (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar9 = this->location;
      this_01 = pSVar7;
      pOVar10 = this;
    }
    AVar20.words = pwVar9;
    AVar20.segment = pSVar7;
    if (this_01->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_01);
    }
    _kjCondition.left = (Kind)(pOVar10->tag).content & OTHER;
    _kjCondition.result = _kjCondition.left == STRUCT;
    _kjCondition.right = STRUCT;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (_kjCondition.result) {
      uVar2 = *(ushort *)((long)&(pOVar10->tag).content + 4);
      uVar3 = *(ushort *)((long)&(pOVar10->tag).content + 6);
      uVar18 = (ulong)uVar3;
      src = (WirePointer *)(pwVar9 + uVar2);
      SVar14.pointers = 0;
      SVar14.data = uVar2;
      pSVar6 = this_01;
      pWVar12 = src;
      uVar4 = uVar3;
      if (uVar3 < uVar16 || uVar2 < size.data) {
        SVar13 = SVar14;
        if (uVar2 <= size.data) {
          SVar13 = size;
        }
        uVar11 = (uint)size >> 0x10;
        if (uVar16 < uVar3) {
          uVar11 = (uint)uVar3;
        }
        SVar14 = (StructSize)((uint)SVar13 & 0xffff);
        if ((((this->tag).content & 3) == 2) &&
           (pSVar6 = BuilderArena::getSegment
                               ((BuilderArena *)(pSVar7->super_SegmentReader).arena,
                                (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
           pSVar6->readOnly == false)) {
          uVar17 = (uint)(this->tag).content;
          puVar8 = (undefined8 *)
                   ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                   (ulong)(uVar17 & 0xfffffff8));
          if ((uVar17 & 4) == 0) {
            *puVar8 = 0;
          }
          else {
            *puVar8 = 0;
            puVar8[1] = 0;
          }
        }
        uVar17 = uVar11 + (int)SVar14;
        (this->tag).content = 0;
        if (this_00 == (BuilderArena *)0x0) {
          if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
            WireHelpers::zeroObject(pSVar7,capTable,(WirePointer *)this);
          }
          if (uVar17 == 0) {
            *(undefined4 *)&(this->tag).content = 0xfffffffc;
            AVar20.words = &this->tag;
          }
          else {
            pwVar15 = pSVar7->pos;
            if ((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                      ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pwVar15)) >> 3 <
                (long)(ulong)uVar17) {
              pwVar15 = (word *)0x0;
            }
            else {
              pSVar7->pos = pwVar15 + uVar17;
            }
            AVar20.words = pwVar15;
            if (pwVar15 == (word *)0x0) {
              AVar20 = BuilderArena::allocate
                                 ((BuilderArena *)(pSVar7->super_SegmentReader).arena,uVar17 + 1);
              ref = (OrphanBuilder *)AVar20.words;
              pSVar7 = AVar20.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar20.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar7->super_SegmentReader).id.value;
              *(undefined4 *)&(ref->tag).content = 0;
              AVar20.words = (word *)&ref->segment;
              AVar20.segment = pSVar7;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar15 - (long)this) >> 1) & 0xfffffffc) - 4;
            }
          }
        }
        else {
          AVar20 = BuilderArena::allocate(this_00,uVar17);
          *(undefined4 *)&(this->tag).content = 0xfffffffc;
        }
        pSVar6 = AVar20.segment;
        *(StructDataWordCount *)((long)&(ref->tag).content + 4) = SVar13.data;
        uVar4 = (ushort)uVar11;
        *(ushort *)((long)&(ref->tag).content + 6) = uVar4;
        if (uVar2 != 0) {
          memcpy(AVar20.words,pwVar9,(ulong)uVar2 << 3);
        }
        pWVar12 = (WirePointer *)(AVar20.words + ((uint)SVar13 & 0xffff));
        dst = pWVar12;
        if (uVar3 != 0) {
          do {
            WireHelpers::transferPointer(pSVar6,dst,this_01,src);
            src = src + 1;
            uVar18 = uVar18 - 1;
            dst = dst + 1;
          } while (uVar18 != 0);
        }
        local_90 = (uint)uVar2;
        if (uVar3 + local_90 != 0) {
          memset(pwVar9,0,(ulong)((uVar3 + local_90) * 8));
        }
      }
      pSVar7 = AVar20.segment;
      __return_storage_ptr__->segment = pSVar6;
      __return_storage_ptr__->capTable = capTable;
      __return_storage_ptr__->data = AVar20.words;
      __return_storage_ptr__->pointers = pWVar12;
      __return_storage_ptr__->dataSize = (int)SVar14 << 6;
      __return_storage_ptr__->pointerCount = uVar4;
      iVar5 = 1;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[88]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x47b,FAILED,"oldRef->kind() == WirePointer::STRUCT",
                 "_kjCondition,\"Schema mismatch: Message contains non-struct pointer where struct pointer was expected.\""
                 ,&_kjCondition,
                 (char (*) [88])
                 "Schema mismatch: Message contains non-struct pointer where struct pointer was expected."
                );
      kj::_::Debug::Fault::~Fault(&f);
      iVar5 = 2;
    }
    if (iVar5 != 2) goto LAB_00186f38;
  }
  AVar19.words = &ref->tag;
  AVar19.segment = pSVar7;
  uVar11 = ((uint)size >> 0x10) + ((uint)size & 0xffff);
  if (this_00 == (BuilderArena *)0x0) {
    if (*(int *)((long)&(ref->tag).content + 4) != 0 || (int)(ref->tag).content != 0) {
      WireHelpers::zeroObject(pSVar7,capTable,(WirePointer *)ref);
    }
    if (uVar11 == 0) {
      *(undefined4 *)&(ref->tag).content = 0xfffffffc;
    }
    else {
      pwVar9 = pSVar7->pos;
      if ((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pwVar9)) >> 3 <
          (long)(ulong)uVar11) {
        pwVar9 = (word *)0x0;
      }
      else {
        pSVar7->pos = pwVar9 + uVar11;
      }
      AVar19.words = pwVar9;
      if (pwVar9 == (word *)0x0) {
        AVar20 = BuilderArena::allocate
                           ((BuilderArena *)(pSVar7->super_SegmentReader).arena,uVar11 + 1);
        pOVar10 = (OrphanBuilder *)AVar20.words;
        pSVar7 = AVar20.segment;
        *(uint *)&(ref->tag).content =
             (int)AVar20.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        *(uint *)((long)&(ref->tag).content + 4) = (pSVar7->super_SegmentReader).id.value;
        *(undefined4 *)&(pOVar10->tag).content = 0;
        AVar19.words = (word *)&pOVar10->segment;
        AVar19.segment = pSVar7;
        ref = pOVar10;
      }
      else {
        *(uint *)&(ref->tag).content =
             ((uint)((ulong)((long)pwVar9 - (long)ref) >> 1) & 0xfffffffc) - 4;
      }
    }
  }
  else {
    AVar19 = BuilderArena::allocate(this_00,uVar11);
    *(undefined4 *)&(ref->tag).content = 0xfffffffc;
  }
  *(StructSize *)((long)&(ref->tag).content + 4) = size;
  __return_storage_ptr__->segment = AVar19.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->data = AVar19.words;
  __return_storage_ptr__->pointers = (WirePointer *)(AVar19.words + ((uint)size & 0xffff));
  __return_storage_ptr__->dataSize = ((uint)size & 0xffff) << 6;
  __return_storage_ptr__->pointerCount = uVar16;
LAB_00186f38:
  this->location = (word *)__return_storage_ptr__->data;
  return __return_storage_ptr__;
}

Assistant:

StructBuilder OrphanBuilder::asStruct(StructSize size) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  StructBuilder result = WireHelpers::getWritableStructPointer(
      tagAsPtr(), location, segment, capTable, size, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = reinterpret_cast<word*>(result.data);

  return result;
}